

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

int zt_hexdump_default_printer(void *ctx,size_t addr,char *hex,char *txt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char buffer [101];
  
  if (hex == (char *)0x0) {
    putchar(10);
  }
  else {
    pcVar1 = hex + 0xc;
    pcVar2 = hex + 0x18;
    pcVar3 = hex + 0x24;
    if (addr < 0xffff) {
      iVar4 = snprintf(buffer,100,"%.4zX   %.12s %.12s %.12s %.12s",addr,hex,pcVar1,pcVar2,pcVar3);
      iVar5 = 0x3b;
    }
    else if (addr < 0xffffffff) {
      iVar4 = snprintf(buffer,100,"%.8zX   %.12s %.12s %.12s %.12s",addr,hex,pcVar1,pcVar2,pcVar3);
      iVar5 = 0x3f;
    }
    else {
      iVar4 = snprintf(buffer,100,"%.16zX   %.12s %.12s %.12s %.12s",addr,hex,pcVar1,pcVar2,pcVar3);
      iVar5 = 0x47;
    }
    snprintf(buffer + iVar4,100 - (long)iVar4,"%*s| %s",(ulong)(uint)(iVar5 - iVar4),"",txt);
    puts(buffer);
  }
  return 0;
}

Assistant:

int
zt_hexdump_default_printer(UNUSED void * ctx, size_t addr, char * hex, char * txt) {
    size_t    offt;
    size_t    base = 55;
    char      buffer[100+1];

    if (hex) {
        if (addr < 65535) {
            offt = snprintf(buffer, 100, "%.4zX   %.12s %.12s %.12s %.12s", addr, hex, hex+(4*3), hex+(8*3), hex+(12*3));
            base += 4;
        } else if (addr < 4294967295UL) {
            offt = snprintf(buffer, 100, "%.8zX   %.12s %.12s %.12s %.12s", addr, hex, hex+(4*3), hex+(8*3), hex+(12*3));
            base += 8;
        } else {
            offt = snprintf(buffer, 100, "%.16zX   %.12s %.12s %.12s %.12s", addr, hex, hex+(4*3), hex+(8*3), hex+(12*3));
            base += 16;
        }

        snprintf(buffer+offt, 100-offt, BLANK "| %s", INDENT_TO(base, 1, offt), txt);
        printf("%s\n", buffer);
    } else {
        printf("\n");
    }
    return 0;
}